

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string *
pugi::impl::anon_unknown_0::convert_number_to_string
          (xpath_string *__return_storage_ptr__,double value,xpath_allocator *alloc)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char cVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char mantissa_buffer [32];
  undefined8 local_58;
  double local_38;
  
  if ((value != 0.0) || (NAN(value))) {
    if (NAN(value)) {
      pcVar5 = "NaN";
    }
    else if ((value + value != value) || (NAN(value + value) || NAN(value))) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = "-Infinity";
      if (0.0 < value) {
        pcVar5 = "Infinity";
      }
    }
  }
  else {
    pcVar5 = "0";
  }
  if (pcVar5 == (char *)0x0) {
    local_58 = value;
    local_38 = value;
    snprintf((char *)&local_58,0x20,"%.*e",0xf);
    pcVar6 = strchr((char *)&local_58,0x65);
    iVar4 = atoi(pcVar6 + 1);
    pcVar5 = (char *)((long)&local_58 + (ulong)((char)local_58 == '-') + 1);
    *pcVar5 = *(char *)((long)&local_58 + (ulong)((char)local_58 == '-'));
    do {
      pcVar11 = pcVar5;
      if (pcVar6 == pcVar5) break;
      pcVar12 = pcVar6 + -1;
      pcVar11 = pcVar6;
      pcVar6 = pcVar6 + -1;
    } while (*pcVar12 == '0');
    uVar9 = iVar4 + 1;
    *pcVar11 = '\0';
    sVar7 = strlen((char *)&local_58);
    uVar2 = -uVar9;
    if (0 < (int)uVar9) {
      uVar2 = uVar9;
    }
    pcVar6 = (char *)xpath_allocator::allocate(alloc,uVar2 + sVar7 + 4);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
      bVar3 = false;
      sVar10 = 0;
    }
    else {
      pcVar11 = pcVar6;
      if (local_38 < 0.0) {
        pcVar11 = pcVar6 + 1;
        *pcVar6 = '-';
      }
      if (iVar4 < 0) {
        *pcVar11 = '0';
        pcVar11 = pcVar11 + 1;
      }
      else {
        iVar4 = iVar4 + 2;
        do {
          cVar1 = *pcVar5;
          cVar8 = cVar1;
          if (cVar1 == '\0') {
            cVar8 = '0';
          }
          pcVar5 = pcVar5 + (cVar1 != '\0');
          *pcVar11 = cVar8;
          pcVar11 = pcVar11 + 1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
        uVar9 = 0;
      }
      if (*pcVar5 != '\0') {
        *pcVar11 = '.';
        pcVar12 = pcVar11 + 1;
        if ((int)uVar9 < 0) {
          memset(pcVar12,0x30,(ulong)-uVar9);
          pcVar12 = pcVar11 + (1 - uVar9);
        }
        cVar1 = *pcVar5;
        pcVar11 = pcVar12;
        while (cVar1 != '\0') {
          pcVar5 = pcVar5 + 1;
          *pcVar11 = cVar1;
          pcVar11 = pcVar11 + 1;
          cVar1 = *pcVar5;
        }
      }
      *pcVar11 = '\0';
      sVar10 = (long)pcVar11 - (long)pcVar6;
      bVar3 = true;
    }
    __return_storage_ptr__->_buffer = pcVar6;
    __return_storage_ptr__->_uses_heap = bVar3;
    __return_storage_ptr__->_length_heap = sVar10;
  }
  else {
    __return_storage_ptr__->_buffer = pcVar5;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xpath_string convert_number_to_string(double value, xpath_allocator* alloc)
	{
		// try special number conversion
		const char_t* special = convert_number_to_string_special(value);
		if (special) return xpath_string::from_const(special);

		// get mantissa + exponent form
		char mantissa_buffer[32];

		char* mantissa;
		int exponent;
		convert_number_to_mantissa_exponent(value, mantissa_buffer, &mantissa, &exponent);

		// allocate a buffer of suitable length for the number
		size_t result_size = strlen(mantissa_buffer) + (exponent > 0 ? exponent : -exponent) + 4;
		char_t* result = static_cast<char_t*>(alloc->allocate(sizeof(char_t) * result_size));
		if (!result) return xpath_string();

		// make the number!
		char_t* s = result;

		// sign
		if (value < 0) *s++ = '-';

		// integer part
		if (exponent <= 0)
		{
			*s++ = '0';
		}
		else
		{
			while (exponent > 0)
			{
				assert(*mantissa == 0 || static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa ? *mantissa++ : '0';
				exponent--;
			}
		}

		// fractional part
		if (*mantissa)
		{
			// decimal point
			*s++ = '.';

			// extra zeroes from negative exponent
			while (exponent < 0)
			{
				*s++ = '0';
				exponent++;
			}

			// extra mantissa digits
			while (*mantissa)
			{
				assert(static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa++;
			}
		}

		// zero-terminate
		assert(s < result + result_size);
		*s = 0;

		return xpath_string::from_heap_preallocated(result, s);
	}